

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O1

void __thiscall TypeDeclarator::~TypeDeclarator(TypeDeclarator *this)

{
  pointer pcVar1;
  bool bVar2;
  pointer ppTVar3;
  ulong uVar4;
  ulong uVar5;
  
  ppTVar3 = (this->mods).super__Vector_base<TypeModifier_*,_std::allocator<TypeModifier_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((this->mods).super__Vector_base<TypeModifier_*,_std::allocator<TypeModifier_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      if (ppTVar3[uVar4] != (TypeModifier *)0x0) {
        (*ppTVar3[uVar4]->_vptr_TypeModifier[1])();
      }
      ppTVar3 = (this->mods).super__Vector_base<TypeModifier_*,_std::allocator<TypeModifier_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar5 < (ulong)((long)(this->mods).
                                    super__Vector_base<TypeModifier_*,_std::allocator<TypeModifier_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3)
      ;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  pcVar1 = (this->model)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->model).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->ident)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->ident).field_2) {
    operator_delete(pcVar1);
  }
  ppTVar3 = (this->mods).super__Vector_base<TypeModifier_*,_std::allocator<TypeModifier_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (ppTVar3 != (pointer)0x0) {
    operator_delete(ppTVar3);
    return;
  }
  return;
}

Assistant:

TypeDeclarator::~TypeDeclarator(void)

{
  for(uint4 i=0;i<mods.size();++i)
    delete mods[i];
}